

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image-util.cc
# Opt level: O0

float SrgbTransform::linearToSrgb(float x)

{
  double dVar1;
  undefined4 local_c;
  float x_local;
  
  if (0.0 < x) {
    if (x < 1.0) {
      if (0.0031308 <= x) {
        dVar1 = std::pow((double)(ulong)(uint)x,5.20828393841762e-315);
        local_c = SUB84(dVar1,0) * 1.055 - 0.055;
      }
      else {
        local_c = x * 12.92;
      }
    }
    else {
      local_c = 1.0;
    }
  }
  else {
    local_c = 0.0;
  }
  return local_c;
}

Assistant:

float linearToSrgb(float x) {
	if (x <= 0.0f)
		return 0.0f;
	else if (x >= 1.0f)
		return 1.0f;
	else if (x < 0.0031308f)
		return x * 12.92f;
	else
		return std::pow(x, 1.0f / 2.4f) * 1.055f - 0.055f;
}